

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::TextureBufferFormatCase::iterate(TextureBufferFormatCase *this)

{
  RenderContext *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  SamplerType SVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  undefined4 extraout_var_02;
  char *description;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Surface referenceFrame;
  RenderParams renderParams;
  ConstPixelBufferAccess effectiveRefTexture;
  TextureFormatInfo spec;
  RandomViewport local_178;
  vector<float,_std::allocator<float>_> local_168;
  Surface local_148;
  TestLog *local_130;
  TextureFormat local_128;
  Surface local_120;
  undefined1 local_104 [44];
  float afStack_d8 [2];
  float local_d0 [4];
  PixelBufferAccess local_c0;
  ConstPixelBufferAccess local_98;
  undefined1 local_70 [32];
  Vec4 local_50;
  Vec4 local_40;
  long lVar7;
  
  local_130 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = this->m_width;
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_178,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),iVar2,1,dVar4);
  tcu::Surface::Surface(&local_148,local_178.width,local_178.height);
  tcu::Surface::Surface(&local_120,local_178.width,local_178.height);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar8 = CONCAT44(extraout_var_01,iVar2);
  bVar10 = 8 - *(char *)(lVar8 + 8);
  uVar5 = 0;
  if (0 < *(int *)(lVar8 + 0x14)) {
    uVar5 = 0x1000000 << (8U - (char)*(int *)(lVar8 + 0x14) & 0x1f);
  }
  uVar12 = 0x100 << (8U - *(char *)(lVar8 + 0xc) & 0x1f) | 1 << (bVar10 & 0x1f);
  uVar5 = 0x10000 << (8U - *(char *)(lVar8 + 0x10) & 0x1f) | uVar12 | uVar5;
  uVar11 = 1 << (bVar10 & 0x1f) & 0xff;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  uVar12 = uVar12 >> 8 & 0xff;
  if (0xfd < uVar12) {
    uVar12 = 0xfe;
  }
  uVar9 = uVar5 >> 0x10 & 0xff;
  if (0xfd < uVar9) {
    uVar9 = 0xfe;
  }
  uVar5 = uVar5 >> 0x18;
  if (0xfd < uVar5) {
    uVar5 = 0xfe;
  }
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_104._0_4_ = TEXTURETYPE_BUFFER;
  local_104._4_4_ = SAMPLERTYPE_FLOAT;
  local_104._8_4_ = 0;
  lVar8 = 3;
  do {
    *(undefined4 *)(local_104 + lVar8 * 4) = 0x3f800000;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 7);
  local_104._28_4_ = 0.0;
  local_104._32_4_ = 0.0;
  lVar8 = 9;
  do {
    *(undefined4 *)(local_104 + lVar8 * 4) = 0x3f800000;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xd);
  local_d0[0] = 0.0;
  local_d0[1] = 0.0;
  local_d0[2] = 0.0;
  local_d0[3] = 0.0;
  glu::getTextureBufferEffectiveRefTexture
            ((PixelBufferAccess *)local_70,this->m_texture,this->m_maxTextureBufferSize);
  local_98.m_format.order = local_70._0_4_;
  local_98.m_format.type = local_70._4_4_;
  local_98.m_size.m_data[0] = local_70._8_4_;
  local_98.m_size.m_data[1] = local_70._12_4_;
  local_98.m_size.m_data[2] = local_70._16_4_;
  local_98.m_pitch.m_data[0] = local_70._20_4_;
  local_98.m_pitch.m_data[1] = local_70._24_4_;
  local_98.m_pitch.m_data[2] = local_70._28_4_;
  local_98.m_data = (void *)local_50.m_data._0_8_;
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_70,&local_98.m_format);
  local_104._8_4_ = local_104._8_4_ | 0xc;
  SVar6 = glu::TextureTestUtil::getFetchSamplerType(local_98.m_format);
  local_104._4_4_ = SVar6;
  local_104._36_4_ = local_50.m_data[0];
  local_104._40_4_ = local_50.m_data[1];
  afStack_d8[0] = local_50.m_data[2];
  afStack_d8[1] = local_50.m_data[3];
  local_d0[0] = local_40.m_data[0];
  local_d0[1] = local_40.m_data[1];
  local_d0[2] = local_40.m_data[2];
  local_d0[3] = local_40.m_data[3];
  glu::TextureTestUtil::computeQuadTexCoord1D(&local_168,0.0,(float)local_98.m_size.m_data[0]);
  (**(code **)(lVar7 + 0x1c0))(0x3e000000,0x3e800000,0x3f000000,0x3f800000);
  (**(code **)(lVar7 + 0x188))(0x4500);
  (**(code **)(lVar7 + 0x188))(0x4500);
  (**(code **)(lVar7 + 0x1a00))(local_178.x,local_178.y,local_178.width,local_178.height);
  glu::TextureBuffer::upload(this->m_texture);
  (**(code **)(lVar7 + 8))(0x84c0);
  (**(code **)(lVar7 + 0xb8))(0x8c2a,this->m_texture->m_glTexture);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
                  ,0x167);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,(RenderParams *)local_104);
  context = this->m_renderCtx;
  local_128.order = RGBA;
  local_128.type = UNORM_INT8;
  if ((void *)local_148.m_pixels.m_cap != (void *)0x0) {
    local_148.m_pixels.m_cap = (size_t)local_148.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_c0,&local_128,local_148.m_width,local_148.m_height,1,
             (void *)local_148.m_pixels.m_cap);
  glu::readPixels(context,local_178.x,local_178.y,&local_c0);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
                  ,0x16d);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_c0,&local_120,
             (PixelFormat *)(CONCAT44(extraout_var_02,iVar2) + 8));
  glu::TextureTestUtil::fetchTexture
            ((SurfaceAccess *)&local_c0,&local_98,
             local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_50,&local_40);
  bVar1 = glu::TextureTestUtil::compareImages
                    (local_130,&local_120,&local_148,
                     (RGBA)((uVar9 << 0x10 | uVar12 << 8 | uVar11 | uVar5 << 0x18) + 0x1010101));
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,description
            );
  if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_120);
  tcu::Surface::~Surface(&local_148);
  return STOP;
}

Assistant:

TextureBufferFormatCase::IterateResult TextureBufferFormatCase::iterate (void)
{
	TestLog&							log						= m_testCtx.getLog();
	const glw::Functions&				gl						= m_renderCtx.getFunctions();
	RandomViewport						viewport				(m_renderCtx.getRenderTarget(), m_width, 1, deStringHash(getName()));
	tcu::Surface						renderedFrame			(viewport.width, viewport.height);
	tcu::Surface						referenceFrame			(viewport.width, viewport.height);
	tcu::RGBA							threshold				= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>						texCoord;
	RenderParams						renderParams			(TEXTURETYPE_BUFFER);
	const tcu::ConstPixelBufferAccess	effectiveRefTexture		= glu::getTextureBufferEffectiveRefTexture(*m_texture, m_maxTextureBufferSize);
	tcu::TextureFormatInfo				spec					= tcu::getTextureFormatInfo(effectiveRefTexture.getFormat());

	renderParams.flags			|= RenderParams::LOG_ALL;
	renderParams.samplerType	= getFetchSamplerType(effectiveRefTexture.getFormat());
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	computeQuadTexCoord1D(texCoord, 0.0f, (float)(effectiveRefTexture.getWidth()));

	gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Setup base viewport.
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Upload texture data to GL.
	m_texture->upload();

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_BUFFER, m_texture->getGLTexture());

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	fetchTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), effectiveRefTexture, &texCoord[0], spec.lookupScale, spec.lookupBias);

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}